

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O0

void __thiscall leveldb::FileMetaData::~FileMetaData(FileMetaData *this)

{
  FileMetaData *this_local;
  
  InternalKey::~InternalKey(&this->largest);
  InternalKey::~InternalKey(&this->smallest);
  return;
}

Assistant:

FileMetaData() : refs(0), allowed_seeks(1 << 30), file_size(0) {}